

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char value,format_specs *specs)

{
  presentation_type pVar1;
  basic_appender<char> bVar2;
  format_specs *in_RDX;
  undefined1 in_SIL;
  anon_class_2_2_bf5026b7 *in_RDI;
  bool is_debug;
  undefined7 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  pVar1 = basic_specs::type(&in_RDX->super_basic_specs);
  bVar2.container._7_1_ = in_SIL;
  bVar2.container._0_7_ = in_stack_ffffffffffffffe8;
  bVar2 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (bVar2,in_RDX,CONCAT17(pVar1 == debug,in_stack_ffffffffffffffd8),in_RDI);
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write_char(OutputIt out, Char value,
                              const format_specs& specs) -> OutputIt {
  bool is_debug = specs.type() == presentation_type::debug;
  return write_padded<Char>(out, specs, 1, [=](reserve_iterator<OutputIt> it) {
    if (is_debug) return write_escaped_char(it, value);
    *it++ = value;
    return it;
  });
}